

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmChkCmp2<(moira::Instr)145,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  Ea<(moira::Mode)6,_2> src;
  Ea<(moira::Mode)6,_2> local_44;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)6,2>(&local_44,this,op & 7,addr);
  if (((uVar5 & 0x7ff) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)145,(moira::Mode)6,2>(this,str,addr,op);
    return;
  }
  cVar4 = 'c';
  lVar7 = 0;
  if (((uVar5 & 0xffff) >> 0xb & 1) == 0) {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "cmp2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
      goto LAB_00371577;
    }
  }
  else {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "chk2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
      goto LAB_00371577;
    }
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
LAB_00371577:
  StrWriter::operator<<(str,&local_44);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Rn)((uVar5 & 0xffff) >> 0xc));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar4 = ';';
    lVar7 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmChkCmp2(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Rn       ( xxxx____________(ext)      );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {
            
            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    if (ext & 0x0800) {
        str << Ins<Instr::CHK2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    } else {
        str << Ins<Instr::CMP2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    }
    str << Av<I, M, S>{};
}